

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachPathLength(JsonEachCursor *p)

{
  undefined1 uVar1;
  long lVar2;
  u32 i;
  u32 uVar3;
  long in_RDI;
  long in_FS_OFFSET;
  char cSaved;
  u32 x;
  char *z;
  u32 n;
  u32 sz;
  JsonParse *in_stack_00000030;
  uint local_1c;
  u32 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = (uint)*(undefined8 *)(in_RDI + 0x50);
  lVar2 = *(long *)(in_RDI + 0x40);
  if (((*(int *)(in_RDI + 8) == 0) && (*(char *)(in_RDI + 0x19) != '\0')) && (1 < local_1c)) {
    do {
      do {
        if (local_1c < 2) goto LAB_002a58c8;
        local_1c = local_1c - 1;
      } while ((*(char *)(lVar2 + (ulong)local_1c) != '[') &&
              (*(char *)(lVar2 + (ulong)local_1c) != '.'));
      local_c = 0;
      uVar1 = *(undefined1 *)(lVar2 + (ulong)local_1c);
      *(undefined1 *)(lVar2 + (ulong)local_1c) = 0;
      i = jsonLookupStep(in_stack_00000030,sz,(char *)p,n);
      *(undefined1 *)(lVar2 + (ulong)local_1c) = uVar1;
    } while ((0xfffffffc < i) ||
            (uVar3 = jsonbPayloadSize((JsonParse *)(in_RDI + 0xc0),i,&local_c),
            i + uVar3 != *(int *)(in_RDI + 0xc)));
  }
LAB_002a58c8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

static int jsonEachPathLength(JsonEachCursor *p){
  u32 n = p->path.nUsed;
  char *z = p->path.zBuf;
  if( p->iRowid==0 && p->bRecursive && n>=2 ){
    while( n>1 ){
      n--;
      if( z[n]=='[' || z[n]=='.' ){
        u32 x, sz = 0;
        char cSaved = z[n];
        z[n] = 0;
        assert( p->sParse.eEdit==0 );
        x = jsonLookupStep(&p->sParse, 0, z+1, 0);
        z[n] = cSaved;
        if( JSON_LOOKUP_ISERROR(x) ) continue;
        if( x + jsonbPayloadSize(&p->sParse, x, &sz) == p->i ) break;
      }
    }
  }
  return n;
}